

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNodePtr xmlDocSetRootElement(xmlDocPtr doc,xmlNodePtr root)

{
  int iVar1;
  xmlNodePtr old;
  
  if ((root != (xmlNodePtr)0x0 && doc != (xmlDocPtr)0x0) && (root->type != XML_NAMESPACE_DECL)) {
    for (old = doc->children; (old != (xmlNodePtr)0x0 && (old->type != XML_ELEMENT_NODE));
        old = old->next) {
    }
    if (old == root) {
      return old;
    }
    xmlUnlinkNodeInternal(root);
    iVar1 = xmlSetTreeDoc(root,doc);
    if (-1 < iVar1) {
      root->parent = (_xmlNode *)doc;
      if (old != (xmlNodePtr)0x0) {
        xmlReplaceNode(old,root);
        return old;
      }
      if (doc->children != (xmlNodePtr)0x0) {
        xmlAddSibling(doc->children,root);
        return (xmlNodePtr)0x0;
      }
      doc->children = root;
      doc->last = root;
      return (xmlNodePtr)0x0;
    }
  }
  return (xmlNodePtr)0x0;
}

Assistant:

xmlNodePtr
xmlDocSetRootElement(xmlDocPtr doc, xmlNodePtr root) {
    xmlNodePtr old = NULL;

    if (doc == NULL) return(NULL);
    if ((root == NULL) || (root->type == XML_NAMESPACE_DECL))
	return(NULL);
    old = doc->children;
    while (old != NULL) {
	if (old->type == XML_ELEMENT_NODE)
	    break;
        old = old->next;
    }
    if (old == root)
        return(old);
    xmlUnlinkNodeInternal(root);
    if (xmlSetTreeDoc(root, doc) < 0)
        return(NULL);
    root->parent = (xmlNodePtr) doc;
    if (old == NULL) {
	if (doc->children == NULL) {
	    doc->children = root;
	    doc->last = root;
	} else {
	    xmlAddSibling(doc->children, root);
	}
    } else {
	xmlReplaceNode(old, root);
    }
    return(old);
}